

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O0

void __thiscall
unodb::test::
tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
assert_node_counts(tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                   *this,node_type_counter_array *expected_node_counts)

{
  bool bVar1;
  char *message;
  array<unsigned_long,_5UL> *container;
  ElementsAreArrayMatcher<unsigned_long> *matcher;
  AssertHelper local_228;
  Message local_220;
  ElementsAreArrayMatcher<unsigned_long> local_218;
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_long>_>
  local_200;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar;
  node_type_counter_array actual_node_counts;
  stringstream local_1a0 [8];
  stringstream dump_sink;
  ostream local_190 [376];
  testing *local_18;
  node_type_counter_array *expected_node_counts_local;
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  local_18 = (testing *)expected_node_counts;
  expected_node_counts_local = (node_type_counter_array *)this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::dump
            (&this->test_db,local_190);
  db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::get_node_counts
            ((node_type_counter_array *)&gtest_ar.message_,&this->test_db);
  testing::ElementsAreArray<std::array<unsigned_long,5ul>>(&local_218,local_18,container);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_long>>
            (&local_200,(internal *)&local_218,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_long>>::
  operator()(local_1e8,(char *)&local_200,(array<unsigned_long,_5UL> *)"(actual_node_counts)");
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_long>_>::
  ~PredicateFormatterFromMatcher(&local_200);
  testing::internal::ElementsAreArrayMatcher<unsigned_long>::~ElementsAreArrayMatcher(&local_218);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x2bf,message);
    testing::internal::AssertHelper::operator=(&local_228,&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void assert_node_counts(
      const node_type_counter_array &expected_node_counts) const {
    // Dump the tree to a string. Do not attempt to check the dump format, only
    // that dumping does not crash
    std::stringstream dump_sink;
    test_db.dump(dump_sink);

    const auto actual_node_counts = test_db.get_node_counts();
    UNODB_ASSERT_THAT(actual_node_counts,
                      ::testing::ElementsAreArray(expected_node_counts));
  }